

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeType.cpp
# Opt level: O2

ostream * sjtu::operator<<(ostream *output,timeType *obj)

{
  bool bVar1;
  bool bVar2;
  ostream *poVar3;
  ostream *this;
  int iVar4;
  char *pcVar5;
  
  iVar4 = obj->month;
  bVar1 = 9 < iVar4;
  bVar2 = obj->day < 10;
  poVar3 = output;
  if (!bVar1) {
    poVar3 = std::operator<<(output,'0');
    iVar4 = obj->month;
  }
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,iVar4);
  this = (ostream *)std::operator<<(poVar3,'-');
  if (bVar2) {
    this = (ostream *)std::operator<<((ostream *)this,'0');
  }
  poVar3 = (ostream *)std::ostream::operator<<(this,obj->day);
  if (bVar1) {
    pcVar5 = " ";
  }
  else {
    pcVar5 = " 0";
  }
  poVar3 = std::operator<<(poVar3,pcVar5);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,obj->hour);
  if (bVar2) {
    pcVar5 = ":0";
  }
  else {
    pcVar5 = ":";
  }
  poVar3 = std::operator<<(poVar3,pcVar5);
  std::ostream::operator<<((ostream *)poVar3,obj->minute);
  return output;
}

Assistant:

std::ostream &operator<<(std::ostream &output, const timeType &obj) {
            if (obj.month < 10) {
                if (obj.day < 10) {
                    if (obj.hour < 10) {
                        if (obj.minute < 10) output << '0' << obj.month << '-' << '0' << obj.day << " 0" << obj.hour << ":0" << obj.minute;
                        else output << '0' << obj.month << '-' << '0' << obj.day << " 0" << obj.hour << ":" << obj.minute;
                    }
                    else {
                        if (obj.minute < 10) output << '0' << obj.month << '-' << '0' << obj.day << " " << obj.hour << ":0" << obj.minute;
                        else output << '0' << obj.month << '-' << '0' << obj.day << " " << obj.hour << ":" << obj.minute;
                    }
                }
                else {
                    if (obj.hour < 10) {
                        if (obj.minute < 10) output << '0' << obj.month << '-' << obj.day << " 0" << obj.hour << ":0" << obj.minute;
                        else output << '0' << obj.month << '-' <<  obj.day << " 0" << obj.hour << ":" << obj.minute;
                    }
                    else {
                        if (obj.minute < 10) output << '0' << obj.month << '-' <<  obj.day << " " << obj.hour << ":0" << obj.minute;
                        else output << '0' << obj.month << '-' <<  obj.day << " " << obj.hour << ":" << obj.minute;
                    }
                }
            }
            else {
                if (obj.day < 10) {
                    if (obj.hour < 10) {
                        if (obj.minute < 10) output << obj.month << '-' << '0' << obj.day << " 0" << obj.hour << ":0" << obj.minute;
                        else output << obj.month << '-' << '0' << obj.day << " 0" << obj.hour << ":" << obj.minute;
                    }
                    else {
                        if (obj.minute < 10) output << obj.month << '-' << '0' << obj.day << " " << obj.hour << ":0" << obj.minute;
                        else output << obj.month << '-' << '0' << obj.day << " " << obj.hour << ":" << obj.minute;
                    }
                }
                else {
                    if (obj.hour < 10) {
                        if (obj.minute < 10) output << obj.month << '-' << obj.day << " 0" << obj.hour << ":0" << obj.minute;
                        else output << obj.month << '-' <<  obj.day << " 0" << obj.hour << ":" << obj.minute;
                    }
                    else {
                        if (obj.minute < 10) output << obj.month << '-' <<  obj.day << " " << obj.hour << ":0" << obj.minute;
                        else output << obj.month << '-' <<  obj.day << " " << obj.hour << ":" << obj.minute;
                    }
                }
            }
            return output;
        }